

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall ProgramOptions::generateExample(ProgramOptions *this)

{
  shared_ptr<DataSet> ds;
  allocator local_39;
  DataSet *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  string local_28;
  
  DataSet::random();
  std::__cxx11::string::string((string *)&local_28,"example.kmd",&local_39);
  DataSet::toFile(local_38,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return;
}

Assistant:

void generateExample() {
    auto ds = DataSet::random(features, vectors, clusters);
    ds->toFile("example.kmd");
  }